

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_descriptor.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::Loop::GetInductionInitValue(Loop *this,Instruction *induction,int64_t *value)

{
  bool bVar1;
  uint32_t uVar2;
  int iVar3;
  DefUseManager *this_00;
  CFG *this_01;
  BasicBlock *bb;
  Instruction *this_02;
  ConstantManager *this_03;
  Constant *this_04;
  undefined4 extraout_var;
  uint64_t uVar4;
  uint32_t uVar5;
  
  this_00 = IRContext::get_def_use_mgr(this->context_);
  uVar5 = 1;
  this_02 = (Instruction *)0x0;
  while( true ) {
    uVar2 = Instruction::NumInOperands(induction);
    if (uVar2 <= uVar5 - 1) break;
    this_01 = IRContext::cfg(this->context_);
    uVar2 = Instruction::GetSingleWordInOperand(induction,uVar5);
    bb = CFG::block(this_01,uVar2);
    bVar1 = IsInsideLoop(this,bb);
    if (!bVar1) {
      uVar2 = Instruction::GetSingleWordInOperand(induction,uVar5 - 1);
      this_02 = analysis::DefUseManager::GetDef(this_00,uVar2);
    }
    uVar5 = uVar5 + 2;
  }
  if (this_02 != (Instruction *)0x0) {
    this_03 = IRContext::get_constant_mgr(this->context_);
    uVar5 = Instruction::result_id(this_02);
    this_04 = analysis::ConstantManager::FindDeclaredConstant(this_03,uVar5);
    if (this_04 != (Constant *)0x0) {
      if (value == (int64_t *)0x0) {
        return true;
      }
      iVar3 = (*this_04->type_->_vptr_Type[10])();
      if (CONCAT44(extraout_var,iVar3) != 0) {
        if (*(char *)(CONCAT44(extraout_var,iVar3) + 0x28) == '\x01') {
          uVar4 = analysis::Constant::GetSignExtendedValue(this_04);
        }
        else {
          uVar4 = analysis::Constant::GetZeroExtendedValue(this_04);
        }
        *value = uVar4;
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool Loop::GetInductionInitValue(const Instruction* induction,
                                 int64_t* value) const {
  Instruction* constant_instruction = nullptr;
  analysis::DefUseManager* def_use_manager = context_->get_def_use_mgr();

  for (uint32_t operand_id = 0; operand_id < induction->NumInOperands();
       operand_id += 2) {
    BasicBlock* bb = context_->cfg()->block(
        induction->GetSingleWordInOperand(operand_id + 1));

    if (!IsInsideLoop(bb)) {
      constant_instruction = def_use_manager->GetDef(
          induction->GetSingleWordInOperand(operand_id));
    }
  }

  if (!constant_instruction) return false;

  const analysis::Constant* constant =
      context_->get_constant_mgr()->FindDeclaredConstant(
          constant_instruction->result_id());
  if (!constant) return false;

  if (value) {
    const analysis::Integer* type = constant->type()->AsInteger();
    if (!type) {
      return false;
    }

    *value = type->IsSigned() ? constant->GetSignExtendedValue()
                              : constant->GetZeroExtendedValue();
  }

  return true;
}